

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cpp
# Opt level: O0

size_t kiste::anon_unknown_6::determine_class_curly_level(parse_context *ctx,line_data_t *line_data)

{
  line_data_t *line_data_local;
  parse_context *ctx_local;
  
  if (line_data->_type == class_begin) {
    ctx_local = (parse_context *)ctx->_curly_level;
  }
  else if (line_data->_type == class_end) {
    ctx_local = (parse_context *)0x0;
  }
  else {
    ctx_local = (parse_context *)ctx->_class_curly_level;
  }
  return (size_t)ctx_local;
}

Assistant:

auto determine_class_curly_level(const parse_context& ctx, const line_data_t& line_data)
        -> std::size_t
    {
      switch (line_data._type)
      {
      case line_type::class_begin:
        return ctx._curly_level;
      case line_type::class_end:
        return 0;
      default:
        return ctx._class_curly_level;
      }
    }